

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack26_16(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined4 uVar16;
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined1 auVar13 [32];
  
  auVar7 = *(undefined1 (*) [16])(in + 1);
  uVar2 = *in;
  uVar1 = *(ulong *)(in + 6);
  auVar15 = vpsllvd_avx2(auVar7,_DAT_00191720);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar1;
  auVar5 = vpsllvd_avx2(auVar17,_DAT_0019dd40);
  auVar15 = vpand_avx(auVar15,_DAT_00191730);
  auVar6._8_8_ = 0x3ff000003fffc00;
  auVar6._0_8_ = 0x3ff000003fffc00;
  auVar5 = vpandq_avx512vl(auVar5,auVar6);
  *out = uVar2 & 0x3ffffff;
  auVar8 = valignd_avx512vl(ZEXT1632(auVar7),ZEXT1632(auVar7),7);
  auVar9 = vpbroadcastd_avx512vl();
  auVar10 = vpblendd_avx2(auVar8,ZEXT432(uVar2),1);
  auVar8 = vpmovsxbd_avx2(ZEXT816(0xe040403020100));
  auVar8 = vpermi2d_avx512vl(auVar8,auVar10,auVar9);
  uVar16 = (undefined4)uVar1;
  auVar9._4_4_ = uVar16;
  auVar9._0_4_ = uVar16;
  auVar9._8_4_ = uVar16;
  auVar9._12_4_ = uVar16;
  auVar9._16_4_ = uVar16;
  auVar9._20_4_ = uVar16;
  auVar9._24_4_ = uVar16;
  auVar9._28_4_ = uVar16;
  auVar10 = vpbroadcastd_avx512vl();
  uVar2 = in[8];
  auVar8 = vpblendd_avx2(auVar8,auVar9,0x80);
  auVar9 = vpsrlvd_avx2(auVar8,_DAT_0018e3a0);
  auVar11._8_4_ = 0x3ffffff;
  auVar11._0_8_ = 0x3ffffff03ffffff;
  auVar11._12_4_ = 0x3ffffff;
  auVar13._16_4_ = 0x3ffffff;
  auVar13._0_16_ = auVar11;
  auVar13._20_4_ = 0x3ffffff;
  auVar13._24_4_ = 0x3ffffff;
  auVar13._28_4_ = 0x3ffffff;
  auVar8 = vpblendd_avx2(ZEXT1632(auVar15),auVar13,0x10);
  auVar8 = vpblendd_avx2(auVar8,auVar10,0x20);
  uVar18 = auVar5._0_8_;
  auVar10._8_8_ = uVar18;
  auVar10._0_8_ = uVar18;
  auVar10._16_8_ = uVar18;
  auVar10._24_8_ = uVar18;
  auVar8 = vpblendd_avx2(auVar8,auVar10,0xc0);
  auVar10 = vpor_avx2(auVar9,auVar8);
  auVar8 = vpand_avx2(auVar9,auVar13);
  auVar8 = vpblendd_avx2(auVar10,auVar8,0x10);
  uVar1 = *(ulong *)(in + 9);
  *(undefined1 (*) [32])(out + 1) = auVar8;
  auVar7 = vpshufd_avx(auVar17,0x55);
  auVar15 = vpmovsxbd_avx(ZEXT416(0x4010100));
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar1;
  auVar5 = vpsllvd_avx2(auVar14,_DAT_00193380);
  auVar7 = vpinsrd_avx(auVar7,uVar2,1);
  auVar4._8_8_ = 0x3ffff0003fffffc;
  auVar4._0_8_ = 0x3ffff0003fffffc;
  auVar6 = vpandq_avx512vl(auVar5,auVar4);
  auVar7 = vpermi2d_avx512vl(auVar15,auVar7,auVar14);
  auVar5 = vpsrlvd_avx2(auVar7,_DAT_00191740);
  auVar7 = vpinsrd_avx(auVar11,(uVar2 & 0xf) << 0x16,0);
  uVar3 = *(ulong *)(in + 0xb);
  auVar7 = vpunpcklqdq_avx(auVar7,auVar6);
  auVar15 = vpor_avx(auVar5,auVar7);
  auVar7 = vpand_avx(auVar5,auVar11);
  auVar15 = vpblendd_avx2(auVar15,auVar7,2);
  auVar7 = vpmovsxbd_avx(ZEXT416(0x401));
  *(undefined1 (*) [16])(out + 9) = auVar15;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar3;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar1;
  auVar7 = vpermi2d_avx512vl(auVar7,auVar15,auVar12);
  auVar15 = vpsrlvd_avx2(auVar7,_DAT_001913d0);
  auVar7 = vpsllvd_avx2(auVar12,_DAT_00193790);
  auVar5._8_8_ = 0x3f0000003ffc000;
  auVar5._0_8_ = 0x3f0000003ffc000;
  auVar7 = vpternlogq_avx512vl(auVar7,auVar15,auVar5,0xec);
  *(long *)(out + 0xd) = auVar7._0_8_;
  out[0xf] = (uint)(uVar3 >> 0x26);
  return in + 0xd;
}

Assistant:

const uint32_t *__fastunpack26_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 20)) << (26 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 14)) << (26 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 8)) << (26 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 2)) << (26 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 26);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 22)) << (26 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 16)) << (26 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 10)) << (26 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 4)) << (26 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 26);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 24)) << (26 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 18)) << (26 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 12)) << (26 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 6)) << (26 - 6);
  out++;
  *out = ((*in) >> 6);
  ++in;
  out++;

  return in;
}